

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json11.cpp
# Opt level: O2

Json __thiscall json11::Json::parse(Json *this,string *in,string *err,JsonParse strategy)

{
  undefined8 uVar1;
  char c;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Json JVar2;
  Json result;
  JsonParser parser;
  undefined1 local_88 [16];
  string local_78;
  undefined1 local_58 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  local_58._8_8_ = 0;
  local_58[0x18] = false;
  local_58._0_8_ = in;
  local_58._16_8_ = err;
  local_58._28_4_ = strategy;
  anon_unknown_21::JsonParser::parse_json((JsonParser *)local_88,(int)(JsonParser *)local_58);
  anon_unknown_21::JsonParser::consume_garbage((JsonParser *)local_58);
  uVar1 = local_88._8_8_;
  if ((bool)local_58[0x18] == true) {
    Json(this);
  }
  else if (local_58._8_8_ == in->_M_string_length) {
    local_88._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (this->m_ptr).super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_88._0_8_;
    (this->m_ptr).super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar1;
    local_88._0_8_ = (string *)0x0;
  }
  else {
    esc_abi_cxx11_((string *)(local_88 + 0x10),
                   (json11 *)(ulong)(uint)(int)(in->_M_dataplus)._M_p[local_58._8_8_],c);
    std::operator+(&local_38,"unexpected trailing ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_88 + 0x10));
    anon_unknown_21::JsonParser::fail((JsonParser *)this,(string *)local_58);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)(local_88 + 0x10));
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88 + 8));
  JVar2.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  JVar2.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Json)JVar2.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Json Json::parse(const string &in, string &err, JsonParse strategy) {
    JsonParser parser { in, 0, err, false, strategy };
    Json result = parser.parse_json(0);

    // Check for any trailing garbage
    parser.consume_garbage();
    if (parser.failed)
        return Json();
    if (parser.i != in.size())
        return parser.fail("unexpected trailing " + esc(in[parser.i]));

    return result;
}